

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rejectEnter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxId enterId,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *enterTest,Status enterStat)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar9;
  DataKey local_28;
  
  local_28 = enterId.super_DataKey;
  iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::number(&this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(SPxId *)&local_28);
  local_28.info = this->theRep * local_28.info;
  lVar8 = (long)iVar7;
  pVVar9 = &this->theCoTest;
  if (0 < local_28.info) {
    pVVar9 = &this->theTest;
  }
  pnVar2 = (pVVar9->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
  uVar5 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
  *(undefined8 *)&pnVar2[lVar8].m_backend.data = *(undefined8 *)(enterTest->m_backend).data._M_elems
  ;
  *(undefined8 *)((long)&pnVar2[lVar8].m_backend.data + 8) = uVar3;
  puVar1 = (uint *)((long)&pnVar2[lVar8].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar4;
  *(undefined8 *)(puVar1 + 2) = uVar5;
  *(undefined8 *)((long)&pnVar2[lVar8].m_backend.data + 0x20) =
       *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
  pnVar2[lVar8].m_backend.exp = (enterTest->m_backend).exp;
  pnVar2[lVar8].m_backend.neg = (enterTest->m_backend).neg;
  iVar6 = (enterTest->m_backend).prec_elem;
  pnVar2[lVar8].m_backend.fpclass = (enterTest->m_backend).fpclass;
  pnVar2[lVar8].m_backend.prec_elem = iVar6;
  *(Status *)
   (*(long *)(*(long *)((this->objLimit).m_backend.data._M_elems +
                       (ulong)(local_28.info < 1) * 2 + -0x1a) + 8) + lVar8 * 4) = enterStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectEnter(
   SPxId enterId,
   R enterTest,
   typename SPxBasisBase<R>::Desc::Status enterStat
)
{
   int enterIdx = this->number(enterId);

   if(isId(enterId))
   {
      theTest[enterIdx] = enterTest;
      this->desc().status(enterIdx) = enterStat;
   }
   else
   {
      theCoTest[enterIdx] = enterTest;
      this->desc().coStatus(enterIdx) = enterStat;
   }
}